

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTAudioEngine_Stop(FACTAudioEngine *pEngine,uint16_t nCategory,uint32_t dwFlags)

{
  LinkedList *pLVar1;
  FACTCue *pFVar2;
  uint8_t uVar3;
  LinkedList **ppLVar4;
  FACTCue *pCue;
  
  FAudio_PlatformLockMutex(pEngine->apiLock);
  ppLVar4 = &pEngine->sbList;
LAB_0010b11b:
  pLVar1 = *ppLVar4;
  if (pLVar1 == (LinkedList *)0x0) {
    FAudio_PlatformUnlockMutex(pEngine->apiLock);
    return 0;
  }
  pCue = *(FACTCue **)((long)pLVar1->entry + 8);
LAB_0010b12c:
  do {
    if (pCue == (FACTCue *)0x0) break;
    if (pCue->playingSound != (FACTSoundInstance *)0x0) {
      uVar3 = FACT_INTERNAL_IsInCategory(pEngine,nCategory,pCue->playingSound->sound->category);
      if (uVar3 != '\0') {
        if ((dwFlags == 1) && (pCue->managed != '\0')) {
          pFVar2 = pCue->next;
          FACTCue_Destroy(pCue);
          pCue = pFVar2;
          goto LAB_0010b12c;
        }
        FACTCue_Stop(pCue,dwFlags);
      }
    }
    pCue = pCue->next;
  } while( true );
  ppLVar4 = &pLVar1->next;
  goto LAB_0010b11b;
}

Assistant:

uint32_t FACTAudioEngine_Stop(
	FACTAudioEngine *pEngine,
	uint16_t nCategory,
	uint32_t dwFlags
) {
	FACTCue *cue, *backup;
	LinkedList *list;

	FAudio_PlatformLockMutex(pEngine->apiLock);
	list = pEngine->sbList;
	while (list != NULL)
	{
		cue = ((FACTSoundBank*) list->entry)->cueList;
		while (cue != NULL)
		{
			if (	cue->playingSound != NULL &&
				FACT_INTERNAL_IsInCategory(
					pEngine,
					nCategory,
					cue->playingSound->sound->category
				)	)
			{
				if (	dwFlags == FACT_FLAG_STOP_IMMEDIATE &&
					cue->managed	)
				{
					/* Just blow this up now */
					backup = cue->next;
					FACTCue_Destroy(cue);
					cue = backup;
				}
				else
				{
					/* If managed, the mixer will destroy for us */
					FACTCue_Stop(cue, dwFlags);
					cue = cue->next;
				}
			}
			else
			{
				cue = cue->next;
			}
		}
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return 0;
}